

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void insch(Terminal *term,wchar_t n)

{
  wchar_t wVar1;
  wchar_t x;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  bool bVar5;
  wchar_t wVar6;
  uint uVar7;
  termline *line;
  wchar_t wVar8;
  wchar_t wVar9;
  termchar *ptVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  wchar_t wVar17;
  long lVar18;
  
  wVar13 = -n;
  wVar3 = n;
  if (n < L'\x01') {
    wVar3 = wVar13;
  }
  wVar1 = term->cols;
  x = (term->curs).x;
  wVar17 = wVar1 - x;
  if (wVar17 <= wVar3) {
    wVar3 = wVar17;
  }
  wVar8 = (term->selend).x;
  wVar9 = (term->curs).y;
  wVar6 = (term->selend).y;
  bVar5 = (term->curs).x < wVar8;
  if (wVar9 != wVar6) {
    bVar5 = wVar9 < wVar6;
  }
  if (bVar5) {
    wVar9 = (term->curs).y;
    wVar11 = (term->selstart).x;
    wVar12 = (term->selstart).y;
    bVar5 = wVar11 < wVar1;
    if (wVar9 != wVar12) {
      bVar5 = wVar12 < wVar9;
    }
    if (bVar5) {
      wVar4 = x + wVar3;
      if (L'\xffffffff' < n) {
        wVar4 = x;
      }
      wVar2 = (term->curs).y;
      bVar5 = wVar2 < wVar12;
      if (wVar2 == wVar12) {
        bVar5 = wVar4 <= wVar11;
      }
      if (bVar5) {
        wVar11 = L'\0';
        if (L'\xffffffff' < n) {
          wVar11 = wVar3;
        }
        bVar5 = wVar6 < wVar9;
        if (wVar9 == wVar6) {
          bVar5 = wVar8 <= wVar1 - wVar11;
        }
        if (bVar5) {
          wVar6 = -wVar3;
          if (L'\xffffffff' < n) {
            wVar6 = wVar3;
          }
          wVar8 = (term->selstart).x + wVar6;
          (term->selstart).x = wVar8;
          wVar6 = wVar6 + (term->selend).x;
          (term->selend).x = wVar6;
          if (wVar8 < x) {
            __assert_fail("term->selstart.x >= term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7d,"void insch(Terminal *, int)");
          }
          if (wVar1 <= wVar8) {
            __assert_fail("term->selstart.x < term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7e,"void insch(Terminal *, int)");
          }
          if (wVar6 <= x) {
            __assert_fail("term->selend.x > term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7f,"void insch(Terminal *, int)");
          }
          if (wVar1 < wVar6) {
            __assert_fail("term->selend.x <= term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb80,"void insch(Terminal *, int)");
          }
          goto LAB_00113117;
        }
      }
      term->selstate = LEXICOGRAPHIC;
      (term->selstart).y = L'\0';
      (term->selstart).x = L'\0';
      (term->selend).y = L'\0';
      (term->selend).x = L'\0';
    }
  }
LAB_00113117:
  check_boundary(term,x,(term->curs).y);
  if (n < L'\0') {
    check_boundary(term,(term->curs).x + wVar3,(term->curs).y);
  }
  line = lineptr(term,(term->curs).y,L'஋',L'\x01');
  if (line->trusted != term->trusted) {
    clear_line(term,line);
    line->trusted = term->trusted;
  }
  uVar7 = wVar1 - (x + wVar3);
  if (n < L'\0') {
    if (0 < (int)uVar7) {
      lVar18 = 0;
      uVar16 = 0;
      do {
        ptVar10 = (termchar *)((long)&line->chars[(term->curs).x].chr + lVar18);
        move_termchar(line,ptVar10,ptVar10 + wVar3);
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0x20;
      } while (uVar16 < uVar7);
    }
    if (wVar1 != x) {
      if (n != wVar13 && SBORROW4(n,wVar13) == n * 2 < 0) {
        wVar13 = n;
      }
      if (wVar17 <= wVar13) {
        wVar13 = wVar17;
      }
      iVar14 = -wVar13;
      do {
        copy_termchar(line,iVar14 + wVar17 + (term->curs).x,&term->erase_char);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 0);
    }
  }
  else {
    if (uVar7 != 0) {
      wVar6 = wVar17;
      if (n < wVar17) {
        wVar6 = n;
      }
      lVar18 = (long)(wVar1 - (x + wVar6));
      lVar15 = -lVar18;
      lVar18 = lVar18 << 5;
      do {
        ptVar10 = (termchar *)((long)&line->chars[(long)(term->curs).x + -1].chr + lVar18);
        move_termchar(line,ptVar10 + wVar3,ptVar10);
        lVar15 = lVar15 + 1;
        lVar18 = lVar18 + -0x20;
      } while (lVar15 != 0);
    }
    if (wVar3 != L'\0') {
      if (n != wVar13 && SBORROW4(n,wVar13) == n * 2 < 0) {
        wVar13 = n;
      }
      if (wVar17 <= wVar13) {
        wVar13 = wVar17;
      }
      do {
        wVar13 = wVar13 + L'\xffffffff';
        copy_termchar(line,(term->curs).x + wVar13,&term->erase_char);
      } while (wVar13 != L'\0');
    }
  }
  return;
}

Assistant:

static void insch(Terminal *term, int n)
{
    int dir = (n < 0 ? -1 : +1);
    int m, j;
    pos eol;
    termline *ldata;

    n = (n < 0 ? -n : n);
    if (n > term->cols - term->curs.x)
        n = term->cols - term->curs.x;
    m = term->cols - term->curs.x - n;

    /*
     * We must de-highlight the selection if it overlaps any part of
     * the region affected by this operation, i.e. the region from the
     * current cursor position to end-of-line, _unless_ the entirety
     * of the selection is going to be moved to the left or right by
     * this operation but otherwise unchanged, in which case we can
     * simply move the highlight with the text.
     */
    eol.y = term->curs.y;
    eol.x = term->cols;
    if (poslt(term->curs, term->selend) && poslt(term->selstart, eol)) {
        pos okstart = term->curs;
        pos okend = eol;
        if (dir > 0) {
            /* Insertion: n characters at EOL will be splatted. */
            okend.x -= n;
        } else {
            /* Deletion: n characters at cursor position will be splatted. */
            okstart.x += n;
        }
        if (posle(okstart, term->selstart) && posle(term->selend, okend)) {
            /* Selection is contained entirely in the interval
             * [okstart,okend), so we need only adjust the selection
             * bounds. */
            term->selstart.x += dir * n;
            term->selend.x += dir * n;
            assert(term->selstart.x >= term->curs.x);
            assert(term->selstart.x < term->cols);
            assert(term->selend.x > term->curs.x);
            assert(term->selend.x <= term->cols);
        } else {
            /* Selection is not wholly contained in that interval, so
             * we must unhighlight it. */
            deselect(term);
        }
    }

    check_boundary(term, term->curs.x, term->curs.y);
    if (dir < 0)
        check_boundary(term, term->curs.x + n, term->curs.y);
    ldata = scrlineptr(term->curs.y);
    check_trust_status(term, ldata);
    if (dir < 0) {
        for (j = 0; j < m; j++)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j,
                          ldata->chars + term->curs.x + j + n);
        while (n--)
            copy_termchar(ldata, term->curs.x + m++, &term->erase_char);
    } else {
        for (j = m; j-- ;)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j + n,
                          ldata->chars + term->curs.x + j);
        while (n--)
            copy_termchar(ldata, term->curs.x + n, &term->erase_char);
    }
}